

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mylinkedList.h
# Opt level: O2

ostream * operator<<(ostream *os,linkedList<char_*> *rhs)

{
  l_node<char_*> *plVar1;
  l_node<char_*> **pplVar2;
  
  if (rhs->size == 0) {
    std::operator<<(os,"EMPTY LIST\n");
  }
  pplVar2 = &rhs->head;
  while (plVar1 = *pplVar2, plVar1 != (l_node<char_*> *)0x0) {
    std::operator<<(os,plVar1->data);
    pplVar2 = &plVar1->next;
    if (plVar1->next != (l_node<char_*> *)0x0) {
      std::operator<<(os,", ");
    }
  }
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const linkedList<T>& rhs)
{
    if (rhs.isEmpty()){
        os << "EMPTY LIST\n";

    }
    for (l_node<T> *temp = rhs.head; temp != nullptr; temp = temp->next)
    {
        os << temp->data;
        if (temp->next != nullptr)
            os << ", ";
    }
//    os<<"\n";
    return os;
}